

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O0

int tcp_get_keepalive(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  int *piVar2;
  socklen_t local_44;
  int local_40;
  socklen_t valsz;
  int val;
  int fd;
  nni_tcp_conn *c;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  _val = arg;
  c._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)buf;
  buf_local = arg;
  valsz = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
  local_40 = 0;
  local_44 = 4;
  iVar1 = getsockopt(valsz,1,9,&local_40,&local_44);
  if (iVar1 == 0) {
    arg_local._4_4_ = nni_copyout_bool(local_40 != 0,szp_local,psStack_28,c._4_4_);
  }
  else {
    piVar2 = __errno_location();
    arg_local._4_4_ = nni_plat_errno(*piVar2);
  }
  return arg_local._4_4_;
}

Assistant:

static int
tcp_get_keepalive(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_tcp_conn *c     = arg;
	int           fd    = nni_posix_pfd_fd(&c->pfd);
	int           val   = 0;
	socklen_t     valsz = sizeof(val);

	if (getsockopt(fd, SOL_SOCKET, SO_KEEPALIVE, &val, &valsz) != 0) {
		return (nni_plat_errno(errno));
	}

	return (nni_copyout_bool(val, buf, szp, t));
}